

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HCrash.cpp
# Opt level: O0

void __thiscall HCrash::ltssf_cz_c(HCrash *this,HModel *ptr_model)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  double *pdVar7;
  reference pvVar8;
  reference pvVar9;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  vector<double,_std::allocator<double>_> *this_00;
  double extraout_XMM0_Qa;
  double sense_col_cost_1;
  double sense_col_cost;
  bool rlv_pv_v_ok;
  bool abs_pv_v_ok;
  double abs_c_v;
  bool pv_ok;
  int c_pri_fn_v;
  int c_n;
  int el_n;
  int mx_c_pri_fn_v;
  double mn_co;
  int su_r_c_pri_v_lm;
  double *colCost;
  int objSense;
  bool local_a1;
  bool local_41;
  int local_38;
  int local_34;
  double local_30;
  int local_24;
  
  *in_RDI = in_RSI;
  iVar5 = HModel::getObjSense((HModel *)*in_RDI);
  pdVar7 = HModel::getcolCost((HModel *)0x1929dd);
  *(undefined4 *)((long)in_RDI + 0x3e4) = 0xffffffff;
  if ((*(byte *)((long)in_RDI + 0x3b9) & 1) == 0) {
    local_24 = 3;
  }
  else {
    local_24 = -3;
  }
  *(undefined4 *)(in_RDI + 0x7d) = 0;
  in_RDI[0x7e] = 0;
  local_30 = 1e+200;
  local_34 = -0x7fff;
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x55),
                      (long)*(int *)((long)in_RDI + 0x3dc));
  local_38 = *pvVar8;
  do {
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x55),
                        (long)(*(int *)((long)in_RDI + 0x3dc) + 1));
    if (*pvVar8 <= local_38) {
      return;
    }
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x52),(long)local_38);
    iVar2 = *pvVar8;
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5b),(long)iVar2);
    if (*pvVar8 != 0) {
      if ((*(byte *)((long)in_RDI + 0x3b9) & 1) == 0) {
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xd),(long)iVar2);
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 7),(long)*pvVar8);
        if (*pvVar8 + *(int *)(in_RDI + 0x7c) <= local_24) goto LAB_00192df2;
      }
      iVar6 = *(int *)(in_RDI + 0x76);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xd),(long)iVar2);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 7),(long)*pvVar8);
      iVar3 = *pvVar8;
      iVar4 = *(int *)((long)in_RDI + 0x3b4);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x13),(long)iVar2);
      iVar6 = iVar6 * iVar3 - iVar4 * *pvVar8;
      if (local_34 <= iVar6) {
        local_41 = (bool)(*(byte *)((long)in_RDI + 0x3ba) & 1);
        if ((*(byte *)((long)in_RDI + 0x3ba) & 1) == 0) {
          this_00 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x4f);
          std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)local_38);
          std::abs((int)this_00);
          pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x4c),(long)iVar2
                             );
          local_a1 = *pvVar9 * 0.01 < extraout_XMM0_Qa;
          if (0.0001 >= extraout_XMM0_Qa) {
            *(int *)((long)in_RDI + 0x414) = *(int *)((long)in_RDI + 0x414) + 1;
          }
          if (!local_a1) {
            *(int *)(in_RDI + 0x83) = *(int *)(in_RDI + 0x83) + 1;
          }
          local_a1 = 0.0001 < extraout_XMM0_Qa && local_a1;
          local_41 = local_a1;
        }
        if (local_41 != false) {
          if (local_34 < iVar6) {
            *(int *)((long)in_RDI + 0x3e4) = iVar2;
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x4f),
                                (long)local_38);
            in_RDI[0x7e] = *pvVar9;
            *(undefined4 *)(in_RDI + 0x7d) = 1;
            local_30 = (double)iVar5 * pdVar7[iVar2];
            local_34 = iVar6;
          }
          else if (iVar6 == local_34) {
            dVar1 = pdVar7[iVar2];
            if (((*(byte *)(in_RDI + 0x77) & 1) != 0) && ((double)iVar5 * dVar1 < local_30)) {
              *(int *)((long)in_RDI + 0x3e4) = iVar2;
              pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x4f),
                                  (long)local_38);
              in_RDI[0x7e] = *pvVar9;
              *(undefined4 *)(in_RDI + 0x7d) = 1;
              local_30 = (double)iVar5 * dVar1;
            }
            *(int *)(in_RDI + 0x7d) = *(int *)(in_RDI + 0x7d) + 1;
          }
        }
      }
    }
LAB_00192df2:
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

void HCrash::ltssf_cz_c(HModel *ptr_model) {
  model = ptr_model;
  //  matrix = model->getMatrix();
  const int objSense = model->getObjSense();
  const double *colCost = model->getcolCost();
  
  cz_c_n = no_ix;
  int su_r_c_pri_v_lm = crsh_mx_pri_v;
  //     Choose a column which has maximium priority function amongst those
  //     with entries in the selected row---making sure that the pivot is
  //     acceptable numerically.
  //
  //     Note
  //
  //     *  Numerical checking is switched off by setting the tolerances to
  //     .  zero.
  //
  //     *  Make sure that tl_crsh_rlv_pv_v < 1 otherwise test
  //     .  abs_c_v/crsh_mtx_c_mx_abs_v(c_n) .gt. tl_crsh_rlv_pv_v
  //     .  will never be satisfied
  
  if (alw_al_bs_cg)
    su_r_c_pri_v_lm = -crsh_mx_pri_v;
  else
    su_r_c_pri_v_lm = crsh_mx_pri_v;
  
  n_eqv_c = 0;
  pv_v = 0.0;
  double mn_co = HSOL_CONST_INF;
  int mx_c_pri_fn_v = -HSOL_CONST_I_INF;
  for (int el_n = CrshARstart[cz_r_n]; el_n < CrshARstart[cz_r_n + 1];
       el_n++) {
    int c_n = CrshARindex[el_n];
    if (crsh_act_c[c_n] == crsh_vr_st_no_act)
      continue;
    //     Don't allow the row to be replaced by a column whose priority to
    //     remain nonbasic is the same or greater.
    if (!alw_al_bs_cg
	&& (crsh_c_ty_pri_v[crsh_c_ty[c_n]] + cz_r_pri_v
	    <= su_r_c_pri_v_lm))
      continue;
    //			If column is worse than current best then break
    int c_pri_fn_v = crsh_fn_cf_pri_v * crsh_c_ty_pri_v[crsh_c_ty[c_n]]
      - crsh_fn_cf_k * crsh_c_k[c_n];
    if (c_pri_fn_v < mx_c_pri_fn_v)
      continue;
    //Pivot is OK if pivots are not being checked
    bool pv_ok = no_ck_pv;
    if (!no_ck_pv) {
      //     Check the matrix entry if it may be used as a pivot.
      double abs_c_v = abs(CrshARvalue[el_n]);
      bool abs_pv_v_ok = abs_c_v > tl_crsh_abs_pv_v;
      bool rlv_pv_v_ok = abs_c_v
	> tl_crsh_rlv_pv_v * crsh_mtx_c_mx_abs_v[c_n];
      if (!abs_pv_v_ok)
	n_abs_pv_no_ok += 1;
      if (!rlv_pv_v_ok)
	n_rlv_pv_no_ok += 1;
      pv_ok = abs_pv_v_ok && rlv_pv_v_ok;
    }
    //If the pivot is not OK then break
    if (!pv_ok)
      continue;
    //    Pivot is OK [or not being checked]
    if (c_pri_fn_v > mx_c_pri_fn_v) {
      //				Better column than best so far
      mx_c_pri_fn_v = c_pri_fn_v;
      cz_c_n = c_n;
      pv_v = CrshARvalue[el_n];
      n_eqv_c = 1;
      double sense_col_cost = objSense*colCost[c_n];
      mn_co = sense_col_cost;
    } else if (c_pri_fn_v == mx_c_pri_fn_v) {
      //				Matches the best column so far: possibly break tie on cost
      double sense_col_cost = objSense*colCost[c_n];
      if (mn_co_tie_bk && (sense_col_cost < mn_co)) {
	cz_c_n = c_n;
	pv_v = CrshARvalue[el_n];
	n_eqv_c = 1;
	mn_co = sense_col_cost;
      }
      n_eqv_c += 1;
    }
  }
}